

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O3

void wiz_proj_demo(void)

{
  menu_conflict *menu;
  region_conflict loc;
  region_conflict local_28;
  
  menu = menu_new(MN_SKIN_SCROLL,&proj_iter);
  local_28.col = 0;
  local_28.row = 0;
  local_28.width = 0;
  local_28.page_rows = 0;
  menu_setpriv(menu,0x3e,(void *)0x0);
  menu->title = "PROJ_ types display";
  menu_layout(menu,&local_28);
  screen_save();
  clear_from(L'\0');
  menu_select(menu,0,false);
  screen_load();
  mem_free(menu);
  return;
}

Assistant:

void wiz_proj_demo(void)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, &proj_iter);
	region loc = { 0, 0, 0, 0 };

	menu_setpriv(m, PROJ_MAX, NULL);

	m->title = "PROJ_ types display";
	menu_layout(m, &loc);

	screen_save();
	clear_from(0);
	menu_select(m, 0, false);
	screen_load();
	mem_free(m);
}